

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringtokenizer.h
# Opt level: O3

void __thiscall QStringTokenizerBase<QStringView,_QChar>::iterator::advance(iterator *this)

{
  QStringTokenizerBase<QStringView,_QChar> *pQVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  storage_type_conflict *psVar7;
  qsizetype qVar8;
  
  pQVar1 = this->tokenizer;
  lVar2 = (this->current).state.end;
  qVar8 = (this->current).state.extra;
  lVar3 = (this->current).state.start;
  do {
    lVar4 = lVar3;
    if (lVar2 < 0) {
      lVar5 = 0;
      psVar7 = (storage_type_conflict *)0x0;
      bVar6 = false;
      goto LAB_00518fd8;
    }
    lVar2 = QStringView::indexOf
                      (&pQVar1->m_haystack,(QChar)(char16_t)*(undefined4 *)&pQVar1->m_needle,
                       lVar4 + qVar8,(pQVar1->super_QStringTokenizerBaseBase).m_cs);
    if (lVar2 < 0) {
      lVar3 = lVar4;
      lVar5 = (pQVar1->m_haystack).m_size;
    }
    else {
      lVar3 = lVar2 + 1;
      qVar8 = 0;
      lVar5 = lVar2;
    }
  } while ((((pQVar1->super_QStringTokenizerBaseBase).m_sb.
             super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
             super_QFlagsStorage<Qt::SplitBehaviorFlags>.i & 1) != 0) && (lVar5 == lVar4));
  lVar5 = lVar5 - lVar4;
  psVar7 = (pQVar1->m_haystack).m_data + lVar4;
  bVar6 = true;
  lVar4 = lVar3;
LAB_00518fd8:
  (this->current).value.m_size = lVar5;
  (this->current).value.m_data = psVar7;
  (this->current).ok = bVar6;
  (this->current).state.start = lVar4;
  (this->current).state.end = lVar2;
  (this->current).state.extra = qVar8;
  return;
}

Assistant:

void advance() {
            Q_ASSERT(current.ok);
            current = tokenizer->next(current.state);
        }